

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O3

bool Rml::Factory::InstanceElementText(Element *parent,String *in_text)

{
  byte c;
  pointer pcVar1;
  undefined **ppuVar2;
  code *pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  size_type sVar6;
  undefined8 this;
  bool bVar7;
  SystemInterface *pSVar8;
  char *pcVar9;
  StreamMemory *this_00;
  Context *this_01;
  String *pSVar10;
  long *plVar11;
  _Alloc_hider _Var12;
  size_type *psVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  byte previous;
  bool inside_brackets;
  bool inside_string;
  UniquePtr<Rml::StreamMemory> stream;
  String close_tag;
  String text;
  String tag;
  String open_tag;
  bool local_f2;
  bool local_f1;
  _Head_base<0UL,_Rml::StreamMemory_*,_false> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Element *local_c8;
  String local_c0;
  _Head_base<0UL,_Rml::Element_*,_false> local_a0;
  undefined1 local_98 [40];
  String local_70;
  undefined1 local_50 [32];
  
  if ((parent == (Element *)0x0) &&
     (bVar7 = Assert("RMLUI_ASSERT(parent)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x165), !bVar7)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pSVar8 = GetSystemInterface();
  if (pSVar8 != (SystemInterface *)0x0) {
    (*pSVar8->_vptr_SystemInterface[3])(pSVar8,&local_c0,in_text);
  }
  sVar5 = local_c0._M_string_length;
  _Var4._M_p = local_c0._M_dataplus._M_p;
  _Var12._M_p = local_c0._M_dataplus._M_p;
  if (0 < (long)local_c0._M_string_length >> 2) {
    lVar14 = ((long)local_c0._M_string_length >> 2) + 1;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_c0._M_dataplus._M_p + 3);
    do {
      _Var12._M_p = (pointer)paVar17;
      if ((0x20 < (ulong)(byte)_Var12._M_p[-3]) ||
         ((0x100002600U >> ((ulong)(byte)_Var12._M_p[-3] & 0x3f) & 1) == 0)) {
        _Var12._M_p = _Var12._M_p + -3;
        goto LAB_0023b7db;
      }
      if ((0x20 < (ulong)(byte)_Var12._M_p[-2]) ||
         ((0x100002600U >> ((ulong)(byte)_Var12._M_p[-2] & 0x3f) & 1) == 0)) {
        _Var12._M_p = _Var12._M_p + -2;
        goto LAB_0023b7db;
      }
      if ((0x20 < (ulong)(byte)_Var12._M_p[-1]) ||
         ((0x100002600U >> ((ulong)(byte)_Var12._M_p[-1] & 0x3f) & 1) == 0)) {
        _Var12._M_p = _Var12._M_p + -1;
        goto LAB_0023b7db;
      }
      if ((0x20 < (ulong)(byte)*_Var12._M_p) ||
         ((0x100002600U >> ((ulong)(byte)*_Var12._M_p & 0x3f) & 1) == 0)) goto LAB_0023b7db;
      lVar14 = lVar14 + -1;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(_Var12._M_p + 4);
      _Var12._M_p = (pointer)(local_c0._M_dataplus._M_p +
                             (local_c0._M_string_length & 0xfffffffffffffffc));
    } while (1 < lVar14);
  }
  lVar14 = (long)(local_c0._M_dataplus._M_p + local_c0._M_string_length) - (long)_Var12._M_p;
  bVar7 = true;
  if (lVar14 == 1) {
LAB_0023b7aa:
    if (((ulong)(byte)*_Var12._M_p < 0x21) &&
       ((0x100002600U >> ((ulong)(byte)*_Var12._M_p & 0x3f) & 1) != 0)) goto LAB_0023bd43;
  }
  else if (lVar14 == 2) {
LAB_0023b78e:
    if (((ulong)(byte)*_Var12._M_p < 0x21) &&
       ((0x100002600U >> ((ulong)(byte)*_Var12._M_p & 0x3f) & 1) != 0)) {
      _Var12._M_p = _Var12._M_p + 1;
      goto LAB_0023b7aa;
    }
  }
  else {
    if (lVar14 != 3) goto LAB_0023bd43;
    if (((ulong)(byte)*_Var12._M_p < 0x21) &&
       ((0x100002600U >> ((ulong)(byte)*_Var12._M_p & 0x3f) & 1) != 0)) {
      _Var12._M_p = _Var12._M_p + 1;
      goto LAB_0023b78e;
    }
  }
LAB_0023b7db:
  if (_Var12._M_p == local_c0._M_dataplus._M_p + local_c0._M_string_length) {
    bVar7 = true;
    goto LAB_0023bd43;
  }
  local_f2 = false;
  local_f1 = false;
  if (local_c0._M_string_length == 0) {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
LAB_0023b8d8:
    pcVar1 = local_98 + 0x10;
    local_98._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"#text","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"#text","");
    InstanceElement((Factory *)local_50,parent,(String *)local_98,&local_70,
                    (XMLAttributes *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_98._0_8_ != pcVar1) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    this = local_50._0_8_;
    if ((ElementText *)local_50._0_8_ == (ElementText *)0x0) {
      Log::Message(LT_ERROR,"Failed to instance text element \'%s\', instancer returned nullptr.",
                   local_c0._M_dataplus._M_p);
      if ((ElementText *)local_50._0_8_ != (ElementText *)0x0) {
        (**(code **)(*(long *)local_50._0_8_ + 0x10))();
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                 *)&local_e8);
    }
    else {
      ppuVar2 = *(undefined ***)local_50._0_8_;
      if (ppuVar2 == &PTR__ElementText_0032fbc8) {
        local_c8 = parent;
        StringUtilities::DecodeRml((String *)local_98,&local_c0);
        ::std::__cxx11::string::operator=((string *)&local_c0,(string *)local_98);
        if ((pointer)local_98._0_8_ != pcVar1) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        ElementText::SetText((ElementText *)this,&local_c0);
        local_a0._M_head_impl = (Element *)local_50._0_8_;
        local_50._0_8_ = (ElementText *)0x0;
        Element::AppendChild(local_c8,(ElementPtr *)&local_a0,true);
        if ((ElementText *)local_a0._M_head_impl != (ElementText *)0x0) {
          (*(((Element *)&(local_a0._M_head_impl)->super_ScriptInterface)->super_ScriptInterface).
            super_Releasable._vptr_Releasable[2])();
        }
        local_a0._M_head_impl = (Element *)0x0;
      }
      else {
        Log::Message(LT_ERROR,
                     "Failed to instance text element \'%s\'. Found type \'%s\', was expecting a derivative of ElementText."
                     ,local_c0._M_dataplus._M_p,
                     *(char **)(ppuVar2[-1] + 8) + (**(char **)(ppuVar2[-1] + 8) == '*'));
      }
      if ((ElementText *)local_50._0_8_ != (ElementText *)0x0) {
        (**(code **)(*(long *)local_50._0_8_ + 0x10))();
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                 *)&local_e8);
      if (ppuVar2 == &PTR__ElementText_0032fbc8) goto LAB_0023bd3b;
    }
    bVar7 = false;
  }
  else {
    uVar15 = 0;
    bVar7 = false;
    bVar16 = 0;
    previous = 0;
    local_c8 = parent;
    do {
      c = _Var4._M_p[uVar15];
      pcVar9 = XMLParseTools::ParseDataBrackets(&local_f2,&local_f1,c,previous);
      sVar6 = local_c0._M_string_length;
      parent = local_c8;
      if (pcVar9 != (char *)0x0) {
        bVar7 = false;
        Log::Message(LT_WARNING,"Failed to instance text element \'%s\'. %s",
                     local_c0._M_dataplus._M_p,pcVar9);
        goto LAB_0023bd43;
      }
      bVar16 = bVar16 | local_f2;
      if (local_f2 == false) {
        bVar7 = (bool)(c == 0x3c | bVar7);
      }
      uVar15 = uVar15 + 1;
      previous = c;
    } while (sVar5 != uVar15);
    if (!bVar7) {
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      if ((bVar16 & 1) != 0) {
        Variant::Variant((Variant *)local_98);
        itlib::
        flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
        ::emplace<char_const(&)[10],Rml::Variant>
                  ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                    *)&local_e8,(char (*) [10])"data-text",(Variant *)local_98);
        Variant::~Variant((Variant *)local_98);
      }
      goto LAB_0023b8d8;
    }
    this_00 = (StreamMemory *)operator_new(0x170);
    StreamMemory::StreamMemory(this_00,sVar6 + 0x20);
    local_f0._M_head_impl = this_00;
    this_01 = Element::GetContext(local_c8);
    if (this_01 == (Context *)0x0) {
      local_98._0_8_ = local_98 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"body","");
    }
    else {
      pSVar10 = Context::GetDocumentsBaseTag_abi_cxx11_(this_01);
      local_98._0_8_ = local_98 + 0x10;
      pcVar1 = (pSVar10->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + pSVar10->_M_string_length);
    }
    ::std::operator+(&local_e8,"<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    plVar11 = (long *)::std::__cxx11::string::append((char *)&local_e8);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_70.field_2._M_allocated_capacity = *psVar13;
      local_70.field_2._8_8_ = plVar11[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar13;
      local_70._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_70._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    paVar17 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar17) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "</",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98);
    plVar11 = (long *)::std::__cxx11::string::append(local_50);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e8.field_2._M_allocated_capacity = *psVar13;
      local_e8.field_2._8_8_ = plVar11[3];
      local_e8._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar13;
      local_e8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_e8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((ElementText *)local_50._0_8_ != (ElementText *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    StreamMemory::Write(local_f0._M_head_impl,local_70._M_dataplus._M_p,local_70._M_string_length);
    Stream::Write(&(local_f0._M_head_impl)->super_Stream,&local_c0);
    StreamMemory::Write(local_f0._M_head_impl,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    StreamMemory::Seek(local_f0._M_head_impl,0,0);
    InstanceElementStream(local_c8,&(local_f0._M_head_impl)->super_Stream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar17) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
              ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)&local_f0);
LAB_0023bd3b:
    bVar7 = true;
  }
LAB_0023bd43:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool Factory::InstanceElementText(Element* parent, const String& in_text)
{
	RMLUI_ASSERT(parent);

	String text;
	if (SystemInterface* system_interface = GetSystemInterface())
		system_interface->TranslateString(text, in_text);

	// If this text node only contains white-space we don't want to construct it.
	const bool only_white_space = std::all_of(text.begin(), text.end(), &StringUtilities::IsWhitespace);
	if (only_white_space)
		return true;

	// See if we need to parse it as RML, and whether the text contains data expressions (curly brackets).
	bool parse_as_rml = false;
	bool has_data_expression = false;

	bool inside_brackets = false;
	bool inside_string = false;
	char previous = 0;
	for (const char c : text)
	{
		const char* error_str = XMLParseTools::ParseDataBrackets(inside_brackets, inside_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to instance text element '%s'. %s", text.c_str(), error_str);
			return false;
		}

		if (inside_brackets)
			has_data_expression = true;
		else if (c == '<')
			parse_as_rml = true;

		previous = c;
	}

	// If the text contains RML elements then run it through the XML parser again.
	if (parse_as_rml)
	{
		RMLUI_ZoneScopedNC("InstanceStream", 0xDC143C);
		auto stream = MakeUnique<StreamMemory>(text.size() + 32);
		Context* context = parent->GetContext();
		String tag = context ? context->GetDocumentsBaseTag() : "body";
		String open_tag = "<" + tag + ">";
		String close_tag = "</" + tag + ">";
		stream->Write(open_tag.c_str(), open_tag.size());
		stream->Write(text);
		stream->Write(close_tag.c_str(), close_tag.size());
		stream->Seek(0, SEEK_SET);

		InstanceElementStream(parent, stream.get());
	}
	else
	{
		RMLUI_ZoneScopedNC("InstanceText", 0x8FBC8F);

		// Attempt to instance the element.
		XMLAttributes attributes;

		// If we have curly brackets in the text, we tag the element so that the appropriate data view (DataViewText) is constructed.
		if (has_data_expression)
			attributes.emplace("data-text", Variant());

		ElementPtr element = Factory::InstanceElement(parent, "#text", "#text", attributes);
		if (!element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s', instancer returned nullptr.", text.c_str());
			return false;
		}

		// Assign the element its text value.
		ElementText* text_element = rmlui_dynamic_cast<ElementText*>(element.get());
		if (!text_element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s'. Found type '%s', was expecting a derivative of ElementText.",
				text.c_str(), rmlui_type_name(*element));
			return false;
		}

		// Unescape any escaped entities or unicode symbols
		text = StringUtilities::DecodeRml(text);

		text_element->SetText(text);

		// Add to active node.
		parent->AppendChild(std::move(element));
	}

	return true;
}